

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_UTF8.h
# Opt level: O2

char * choc::text::findInvalidUTF8Data(void *dataToCheck,size_t numBytes)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  UTF8Pointer local_38;
  
  if (dataToCheck == (void *)0x0) {
    soul::throwInternalCompilerError("dataToCheck != nullptr","findInvalidUTF8Data",0xc4);
  }
  uVar3 = 0;
  do {
    while( true ) {
      uVar5 = uVar3;
      uVar6 = 0x40;
      if (numBytes <= uVar5) {
        return (char *)0x0;
      }
      bVar2 = *(byte *)((long)dataToCheck + uVar5);
      if ((char)bVar2 < '\x01') break;
      uVar3 = uVar5 + 1;
    }
    if (bVar2 == 0) {
      return (char *)0x0;
    }
    pcVar1 = (char *)((long)dataToCheck + uVar5);
    uVar7 = 0;
    for (; (uVar6 & bVar2) != 0; uVar6 = uVar6 >> 1) {
      if (2 < uVar7) {
        return pcVar1;
      }
      if (numBytes <= uVar7 + uVar5 + 1) {
        return pcVar1;
      }
      if ((uVar7 == 2) &&
         (local_38.text = pcVar1, uVar4 = UTF8Pointer::operator*(&local_38), 0x10ffff < uVar4)) {
        return pcVar1;
      }
      uVar7 = uVar7 + 1;
    }
    if (uVar7 == 0) {
      return pcVar1;
    }
    uVar3 = uVar7 + uVar5 + 1;
    if ((int)uVar7 != 0) {
      uVar3 = uVar5 + 2;
    }
  } while( true );
}

Assistant:

inline const char* findInvalidUTF8Data (const void* dataToCheck, size_t numBytes)
{
    CHOC_ASSERT (dataToCheck != nullptr);
    auto source = static_cast<const char*> (dataToCheck);
    size_t offset = 0;

    for (;;)
    {
        if (offset >= numBytes)
            return nullptr;

        auto byte = static_cast<signed char> (source[offset]);

        if (byte > 0)
        {
            ++offset;
            continue;
        }

        if (byte == 0)
            return nullptr;

        int testBit = 0x40, numExtraBytes = 0;

        while ((byte & testBit) != 0)
        {
            testBit >>= 1;
            ++numExtraBytes;

            if (numExtraBytes > 3
                || offset + static_cast<size_t> (numExtraBytes) >= numBytes
                || (numExtraBytes == 3 && *UTF8Pointer (source + offset) > 0x10ffff))
            {
                numExtraBytes = 0;
                break;
            }
        }

        if (numExtraBytes == 0)
            break;

        ++offset;

        for (int i = 0; i < numExtraBytes; ++i)
            if ((source[offset++] & 0xc0) != 0x80)
                break;
    }

    return source + offset;
}